

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

void event_free(event *ev)

{
  event_del_(ev,2);
  event_debug_note_teardown_(ev);
  if (mm_free_fn_ != (_func_void_void_ptr *)0x0) {
    (*mm_free_fn_)(ev);
    return;
  }
  free(ev);
  return;
}

Assistant:

void
event_free(struct event *ev)
{
	/* This is disabled, so that events which have been finalized be a
	 * valid target for event_free(). That's */
	// event_debug_assert_is_setup_(ev);

	/* make sure that this event won't be coming back to haunt us. */
	event_del(ev);
	event_debug_note_teardown_(ev);
	mm_free(ev);

}